

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O3

Status __thiscall spvtools::opt::TrimCapabilitiesPass::Process(TrimCapabilitiesPass *this)

{
  bool bVar1;
  Status SVar2;
  Status SVar3;
  pair<spvtools::EnumSet<spv::Capability>,_spvtools::EnumSet<spvtools::Extension>_> local_60;
  
  bVar1 = HasForbiddenCapabilities(this);
  SVar2 = SuccessWithoutChange;
  if (!bVar1) {
    DetermineRequiredCapabilitiesAndExtensions(&local_60,this);
    SVar2 = TrimUnrequiredCapabilities(this,&local_60.first);
    SVar3 = TrimUnrequiredExtensions(this,&local_60.second);
    if (local_60.second.buckets_.
        super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.second.buckets_.
                      super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_60.second.buckets_.
                            super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.second.buckets_.
                            super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_60.first.buckets_.
        super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.first.buckets_.
                      super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_60.first.buckets_.
                            super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.first.buckets_.
                            super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    SVar2 = (SVar3 == SuccessWithChange || SVar2 == SuccessWithChange) ^ SuccessWithoutChange;
  }
  return SVar2;
}

Assistant:

Pass::Status TrimCapabilitiesPass::Process() {
  if (HasForbiddenCapabilities()) {
    return Status::SuccessWithoutChange;
  }

  auto[required_capabilities, required_extensions] =
      DetermineRequiredCapabilitiesAndExtensions();

  Pass::Status capStatus = TrimUnrequiredCapabilities(required_capabilities);
  Pass::Status extStatus = TrimUnrequiredExtensions(required_extensions);

  return capStatus == Pass::Status::SuccessWithChange ||
                 extStatus == Pass::Status::SuccessWithChange
             ? Pass::Status::SuccessWithChange
             : Pass::Status::SuccessWithoutChange;
}